

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_extensions.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBExtensionsInit(ClientContext *context,TableFunctionInitInput *input)

{
  key_type *__k;
  _Hash_node_base *this;
  _Head_base<0UL,_duckdb::DuckDBExtensionsData_*,_false> _Var1;
  bool bVar2;
  idx_t iVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>_>
  *puVar6;
  iterator iVar7;
  pointer pEVar8;
  pointer pDVar9;
  _Base_ptr p_Var10;
  ClientContext *extraout_RDX;
  ClientContext *context_00;
  ClientContext *extraout_RDX_00;
  idx_t index;
  idx_t k;
  idx_t index_00;
  __node_base *p_Var11;
  allocator local_191;
  _Head_base<0UL,_duckdb::DuckDBExtensionsData_*,_false> local_190;
  ExtensionAlias alias;
  _Manager_type local_178;
  code *pcStack_170;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_168;
  DatabaseInstance *local_160;
  FileSystem *local_158;
  TableFunctionInitInput *local_150;
  idx_t local_148;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
  installed_extensions;
  DefaultExtension extension;
  string ext_directory;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ExtensionInstallMode local_b0;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  pointer local_68;
  pointer pVStack_60;
  pointer local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_168._M_head_impl = (GlobalTableFunctionState *)context;
  make_uniq<duckdb::DuckDBExtensionsData>();
  local_158 = FileSystem::GetFileSystem((ClientContext *)input);
  local_150 = input;
  local_160 = DatabaseInstance::GetDatabase((ClientContext *)input);
  installed_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &installed_extensions._M_t._M_impl.super__Rb_tree_header._M_header;
  installed_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  installed_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  installed_extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  installed_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       installed_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_148 = ExtensionHelper::DefaultExtensionCount();
  iVar3 = ExtensionHelper::ExtensionAliasCount();
  context_00 = extraout_RDX;
  for (index = 0; index != local_148; index = index + 1) {
    ExtensionHelper::GetDefaultExtension(&extension,index);
    ext_directory._M_dataplus._M_p = (pointer)&ext_directory.field_2;
    ext_directory._M_string_length = 0;
    ext_directory.field_2._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_a8._M_p = (pointer)&local_98;
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    local_88._M_p = (pointer)&local_78;
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_68 = (pointer)0x0;
    pVStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    ::std::__cxx11::string::assign((char *)&ext_directory);
    if (extension.statically_loaded == true) {
      ::std::__cxx11::string::string((string *)&alias,"(BUILT-IN)",&local_191);
    }
    else {
      alias.extension = (char *)0x0;
      alias.alias = (char *)&local_178;
      local_178 = (_Manager_type)((ulong)local_178 & 0xffffffffffffff00);
    }
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&alias);
    ::std::__cxx11::string::~string((string *)&alias);
    local_b0 = NOT_INSTALLED - extension.statically_loaded;
    ::std::__cxx11::string::assign((char *)&local_88);
    for (index_00 = 0; iVar3 != index_00; index_00 = index_00 + 1) {
      alias = ExtensionHelper::GetExtensionAlias(index_00);
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ext_directory,alias.extension);
      if (bVar2) {
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<char_const*&>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_68,&alias.alias);
      }
    }
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
             ::operator[](&installed_extensions,(key_type *)&ext_directory);
    ExtensionInformation::operator=(pmVar4,(ExtensionInformation *)&ext_directory);
    ExtensionInformation::~ExtensionInformation((ExtensionInformation *)&ext_directory);
    context_00 = extraout_RDX_00;
  }
  ExtensionHelper::GetExtensionDirectoryPath_abi_cxx11_
            (&ext_directory,(ExtensionHelper *)local_150,context_00);
  local_178 = (_Manager_type)0x0;
  pcStack_170 = (code *)0x0;
  alias = (ExtensionAlias)ZEXT816(0);
  pcVar5 = (char *)operator_new(0x18);
  *(FileSystem **)pcVar5 = local_158;
  *(string **)(pcVar5 + 8) = &ext_directory;
  *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
    **)(pcVar5 + 0x10) = &installed_extensions;
  alias.alias = pcVar5;
  pcStack_170 = ::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_extensions.cpp:101:30)>
                ::_M_invoke;
  local_178 = ::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_extensions.cpp:101:30)>
              ::_M_manager;
  (*local_158->_vptr_FileSystem[0x11])(local_158,&ext_directory,&alias,0);
  ::std::_Function_base::~_Function_base((_Function_base *)&alias);
  puVar6 = DatabaseInstance::GetExtensions_abi_cxx11_(local_160);
  p_Var11 = &(puVar6->_M_h)._M_before_begin;
  while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
    if (*(char *)&p_Var11[5]._M_nxt == '\x01') {
      __k = (key_type *)(p_Var11 + 1);
      if (p_Var11[6]._M_nxt != (_Hash_node_base *)0x0) {
        iVar7 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
                ::find(&installed_extensions._M_t,__k);
        this = p_Var11 + 6;
        if (((_Rb_tree_header *)iVar7._M_node ==
             &installed_extensions._M_t._M_impl.super__Rb_tree_header) ||
           (*(byte *)((long)&iVar7._M_node[3]._M_color + 1) == 0)) {
          pmVar4 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
                                 *)&installed_extensions._M_t,__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar4);
          pmVar4->loaded = true;
          unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
          ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                        *)this);
          ::std::__cxx11::string::_M_assign((string *)&pmVar4->extension_version);
          pEVar8 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                   ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                                 *)this);
          pmVar4->installed = pEVar8->mode == STATICALLY_LINKED;
          pEVar8 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                   ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                                 *)this);
          pmVar4->install_mode = pEVar8->mode;
          pEVar8 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                   ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                                 *)this);
          if ((pEVar8->mode == STATICALLY_LINKED) && ((pmVar4->file_path)._M_string_length == 0)) {
            ::std::__cxx11::string::assign((char *)&pmVar4->file_path);
          }
        }
        else {
          *(undefined1 *)&iVar7._M_node[3]._M_color = _S_black;
          unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
          ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                        *)this);
          ::std::__cxx11::string::_M_assign((string *)&iVar7._M_node[7]._M_parent);
        }
      }
      if (p_Var11[7]._M_nxt != (_Hash_node_base *)0x0) {
        iVar7 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
                ::find(&installed_extensions._M_t,__k);
        if ((_Rb_tree_header *)iVar7._M_node !=
            &installed_extensions._M_t._M_impl.super__Rb_tree_header) {
          unique_ptr<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>,_true>
          ::operator->((unique_ptr<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>,_true>
                        *)(p_Var11 + 7));
          ::std::__cxx11::string::_M_assign((string *)&iVar7._M_node[5]._M_left);
        }
      }
    }
  }
  pDVar9 = unique_ptr<duckdb::DuckDBExtensionsData,_std::default_delete<duckdb::DuckDBExtensionsData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBExtensionsData,_std::default_delete<duckdb::DuckDBExtensionsData>,_true>
                         *)&local_190);
  ::std::vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>::
  reserve(&(pDVar9->entries).
           super_vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>
          ,installed_extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var10 = installed_extensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      _Var1._M_head_impl = local_190._M_head_impl,
      (_Rb_tree_header *)p_Var10 != &installed_extensions._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10)) {
    pDVar9 = unique_ptr<duckdb::DuckDBExtensionsData,_std::default_delete<duckdb::DuckDBExtensionsData>,_true>
             ::operator->((unique_ptr<duckdb::DuckDBExtensionsData,_std::default_delete<duckdb::DuckDBExtensionsData>,_true>
                           *)&local_190);
    ::std::vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>::
    emplace_back<duckdb::ExtensionInformation>
              (&(pDVar9->entries).
                super_vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>
               ,(ExtensionInformation *)(p_Var10 + 2));
  }
  local_190._M_head_impl = (DuckDBExtensionsData *)0x0;
  (local_168._M_head_impl)->_vptr_GlobalTableFunctionState = (_func_int **)_Var1._M_head_impl;
  ::std::__cxx11::string::~string((string *)&ext_directory);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
  ::~_Rb_tree(&installed_extensions._M_t);
  if (local_190._M_head_impl != (DuckDBExtensionsData *)0x0) {
    (*((local_190._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])
              ();
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )local_168._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBExtensionsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBExtensionsData>();

	auto &fs = FileSystem::GetFileSystem(context);
	auto &db = DatabaseInstance::GetDatabase(context);

	// Firstly, we go over all Default Extensions: duckdb_extensions always prints those, installed/loaded or not
	map<string, ExtensionInformation> installed_extensions;
	auto extension_count = ExtensionHelper::DefaultExtensionCount();
	auto alias_count = ExtensionHelper::ExtensionAliasCount();
	for (idx_t i = 0; i < extension_count; i++) {
		auto extension = ExtensionHelper::GetDefaultExtension(i);
		ExtensionInformation info;
		info.name = extension.name;
		info.installed = extension.statically_loaded;
		info.loaded = false;
		info.file_path = extension.statically_loaded ? "(BUILT-IN)" : string();
		info.install_mode =
		    extension.statically_loaded ? ExtensionInstallMode::STATICALLY_LINKED : ExtensionInstallMode::NOT_INSTALLED;
		info.description = extension.description;
		for (idx_t k = 0; k < alias_count; k++) {
			auto alias = ExtensionHelper::GetExtensionAlias(k);
			if (info.name == alias.extension) {
				info.aliases.emplace_back(alias.alias);
			}
		}
		installed_extensions[info.name] = std::move(info);
	}

	// Secondly we scan all installed extensions and their install info
#ifndef WASM_LOADABLE_EXTENSIONS
	auto ext_directory = ExtensionHelper::GetExtensionDirectoryPath(context);
	fs.ListFiles(ext_directory, [&](const string &path, bool is_directory) {
		if (!StringUtil::EndsWith(path, ".duckdb_extension")) {
			return;
		}
		ExtensionInformation info;
		info.name = fs.ExtractBaseName(path);
		info.installed = true;
		info.loaded = false;
		info.file_path = fs.JoinPath(ext_directory, path);

		// Check the info file for its installation source
		auto info_file_path = fs.JoinPath(ext_directory, path + ".info");

		// Read the info file
		auto extension_install_info = ExtensionInstallInfo::TryReadInfoFile(fs, info_file_path, info.name);
		info.install_mode = extension_install_info->mode;
		info.extension_version = extension_install_info->version;
		if (extension_install_info->mode == ExtensionInstallMode::REPOSITORY) {
			info.installed_from = ExtensionRepository::GetRepository(extension_install_info->repository_url);
		} else {
			info.installed_from = extension_install_info->full_path;
		}

		auto entry = installed_extensions.find(info.name);
		if (entry == installed_extensions.end()) {
			installed_extensions[info.name] = std::move(info);
		} else {
			if (entry->second.install_mode != ExtensionInstallMode::STATICALLY_LINKED) {
				entry->second.file_path = info.file_path;
				entry->second.install_mode = info.install_mode;
				entry->second.installed_from = info.installed_from;
				entry->second.install_mode = info.install_mode;
				entry->second.extension_version = info.extension_version;
			}
			entry->second.installed = true;
		}
	});
#endif

	// Finally, we check the list of currently loaded extensions
	auto &extensions = db.GetExtensions();
	for (auto &e : extensions) {
		if (!e.second.is_loaded) {
			continue;
		}
		auto &ext_name = e.first;
		auto &ext_data = e.second;
		if (auto &ext_install_info = ext_data.install_info) {
			auto entry = installed_extensions.find(ext_name);
			if (entry == installed_extensions.end() || !entry->second.installed) {
				ExtensionInformation &info = installed_extensions[ext_name];

				info.name = ext_name;
				info.loaded = true;
				info.extension_version = ext_install_info->version;
				info.installed = ext_install_info->mode == ExtensionInstallMode::STATICALLY_LINKED;
				info.install_mode = ext_install_info->mode;
				if (ext_data.install_info->mode == ExtensionInstallMode::STATICALLY_LINKED && info.file_path.empty()) {
					info.file_path = "(BUILT-IN)";
				}
			} else {
				entry->second.loaded = true;
				entry->second.extension_version = ext_install_info->version;
			}
		}
		if (auto &ext_load_info = ext_data.load_info) {
			auto entry = installed_extensions.find(ext_name);
			if (entry != installed_extensions.end()) {
				entry->second.description = ext_load_info->description;
			}
		}
	}

	result->entries.reserve(installed_extensions.size());
	for (auto &kv : installed_extensions) {
		result->entries.push_back(std::move(kv.second));
	}
	return std::move(result);
}